

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cpp
# Opt level: O0

void __thiscall pstore::database::~database(database *this)

{
  database *this_local;
  
  this->_vptr_database = (_func_int **)&PTR__database_001ba3e0;
  no_ex_escape<pstore::database::~database()::__0>((anon_class_8_1_8991fb9c)this);
  std::__cxx11::string::~string((string *)&this->sync_name_);
  std::array<std::shared_ptr<pstore::index::index_base>,_6UL>::~array(&this->indices_);
  std::unique_lock<pstore::file::range_lock>::~unique_lock(&this->lock_);
  pstore::file::range_lock::~range_lock(&this->range_lock_);
  std::shared_ptr<pstore::header>::~shared_ptr(&this->header_);
  storage::~storage(&this->storage_);
  return;
}

Assistant:

database::~database () noexcept {
        no_ex_escape ([this] () { this->close (); });
    }